

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

void CopyOptionValue(TidyDocImpl *doc,TidyOptionImpl *option,TidyOptionValue *oldval,
                    TidyOptionValue *newval)

{
  ctmbstr s1;
  ctmbstr s2;
  char *pcVar1;
  int iVar2;
  TidyOptionValue TVar3;
  bool bVar4;
  
  if (oldval == (TidyOptionValue *)0x0) {
    __assert_fail("oldval != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                  ,0x185,
                  "void CopyOptionValue(TidyDocImpl *, const TidyOptionImpl *, TidyOptionValue *, const TidyOptionValue *)"
                 );
  }
  if (doc->pConfigChangeCallback == (TidyConfigChangeCallback)0x0) {
LAB_00133a80:
    bVar4 = false;
  }
  else if (option->type == TidyString) {
    s1 = oldval->p;
    s2 = newval->p;
    if (s1 == s2) goto LAB_00133a80;
    bVar4 = true;
    if (s2 != (ctmbstr)0x0 && s1 != (ctmbstr)0x0) {
      iVar2 = prvTidytmbstrcmp(s1,s2);
      bVar4 = iVar2 == 0;
      goto LAB_00133a52;
    }
  }
  else {
    bVar4 = oldval->v == newval->v;
LAB_00133a52:
    bVar4 = !bVar4;
  }
  if (((option->type == TidyString) && (pcVar1 = oldval->p, pcVar1 != (char *)0x0)) &&
     (pcVar1 != option->pdflt)) {
    (*doc->allocator->vtbl->free)(doc->allocator,pcVar1);
  }
  if (option->type == TidyString) {
    TVar3 = (TidyOptionValue)newval->p;
    if (((ctmbstr)TVar3.v == (ctmbstr)0x0) || ((ctmbstr)TVar3.v == option->pdflt)) {
      *oldval = TVar3;
      goto LAB_00133ad4;
    }
    TVar3.p = prvTidytmbstrdup(doc->allocator,TVar3.p);
  }
  else {
    TVar3 = *newval;
  }
  *oldval = TVar3;
LAB_00133ad4:
  if ((bVar4) && (doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0)) {
    (*doc->pConfigChangeCallback)((TidyDoc)doc,(TidyOption)option);
    return;
  }
  return;
}

Assistant:

static void CopyOptionValue( TidyDocImpl* doc, const TidyOptionImpl* option,
                             TidyOptionValue* oldval, const TidyOptionValue* newval )
{
    Bool fire_callback = no;
    assert( oldval != NULL );

    /* Compare the old and new values. */
    if ( doc->pConfigChangeCallback )
    {
        if ( option->type == TidyString )
            fire_callback = OptionChangedValuesDiffer( oldval->p, newval->p );
        else
            fire_callback = oldval->v != newval->v;
    }

    FreeOptionValue( doc, option, oldval );

    if ( option->type == TidyString )
    {
        if ( newval->p && newval->p != option->pdflt )
            oldval->p = TY_(tmbstrdup)( doc->allocator, newval->p );
        else
            oldval->p = newval->p;
    }
    else
        oldval->v = newval->v;

    if ( fire_callback )
        PerformOptionChangedCallback( doc, option );
}